

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O2

void __thiscall ArgParser::handleMoo(ArgParser *this,string *p)

{
  allocator<char> local_7a;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"got moo=",&local_79);
  if (p->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"(none)",&local_7a);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,(string *)p);
  }
  std::operator+(&local_38,&local_58,&local_78);
  output(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void
ArgParser::handleMoo(std::string const& p)
{
    output(std::string("got moo=") + (p.empty() ? "(none)" : p));
}